

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void dynamic_switch_emulator_id(uint index)

{
  pointer pcVar1;
  _Head_base<0UL,_Player_*,_false> _Var2;
  _Head_base<0UL,_Player_*,_false> _Var3;
  undefined4 uVar4;
  uint *puVar5;
  uint channel;
  ulong uVar6;
  unique_lock<std::mutex> lock;
  Emulator_Id new_id;
  Emulator_Id old_id;
  unique_lock<std::mutex> local_90;
  undefined8 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar6 = (ulong)active_emulator_id;
  if (active_emulator_id != index) {
    local_58._0_4_ =
         emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6].player;
    local_58._4_4_ =
         emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6].emulator;
    pcVar1 = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6].name._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,
               pcVar1 + emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6].name._M_string_length);
    local_80._0_4_ =
         emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
         super__Vector_impl_data._M_start[index].player;
    local_80._4_4_ =
         emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
         super__Vector_impl_data._M_start[index].emulator;
    pcVar1 = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
             super__Vector_impl_data._M_start[index].name._M_dataplus._M_p;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar1,
               pcVar1 + emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                        _M_impl.super__Vector_impl_data._M_start[index].name._M_string_length);
    if ((ulong)active_emulator_id == 0xffffffff) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                     _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
    }
    _Var2._M_head_impl =
         player[uVar6]._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
         super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
         super__Head_base<0UL,_Player_*,_false>._M_head_impl;
    local_90._M_device = &(_Var2._M_head_impl)->mutex_;
    local_90._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_90);
    local_90._M_owns = true;
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_Player + 0x28))(_Var2._M_head_impl);
    if ((int)local_58 == (int)local_80) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_Player + 0x38))
                (_Var2._M_head_impl,local_80._4_4_);
    }
    else {
      _Var3._M_head_impl =
           player[local_80 & 0xffffffff]._M_t.
           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
           super__Head_base<0UL,_Player_*,_false>._M_head_impl;
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 0x38))
                (_Var3._M_head_impl,local_80._4_4_);
      uVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_Player + 0x50))(_Var2._M_head_impl);
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 0x58))(_Var3._M_head_impl,uVar4);
      uVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_Player + 0x78))(_Var2._M_head_impl);
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 0x70))(_Var3._M_head_impl,uVar4);
      puVar5 = &channel_map[0].bank_lsb;
      uVar6 = 0;
      do {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 200))
                  (_Var3._M_head_impl,uVar6 & 0xffffffff,puVar5[-1]);
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 0xd0))
                  (_Var3._M_head_impl,uVar6 & 0xffffffff,*puVar5);
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_Player + 0xb8))
                  (_Var3._M_head_impl,uVar6 & 0xffffffff,((Program *)(puVar5 + -2))->gm);
        uVar6 = uVar6 + 1;
        puVar5 = puVar5 + 3;
      } while (uVar6 != 0x10);
    }
    active_emulator_id = index;
    std::unique_lock<std::mutex>::~unique_lock(&local_90);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

void dynamic_switch_emulator_id(unsigned index)
{
    if (index == active_emulator_id)
        return;

    Emulator_Id old_id = emulator_ids[active_emulator_id];
    Emulator_Id new_id  = emulator_ids[index];

    Player &player = active_player();
    auto lock = player.take_lock();

    player.panic();
    if (old_id.player == new_id.player) {
        player.set_emulator(new_id.emulator);
    }
    else {
        Player &new_player = *::player[(unsigned)new_id.player];
        new_player.set_emulator(new_id.emulator);
        new_player.set_chip_count(player.chip_count());
        new_player.set_channel_alloc_mode(player.get_channel_alloc_mode());
        // transmit bank change and program change events
        for (unsigned channel = 0; channel < 16; ++channel) {
            new_player.rt_bank_change_msb(channel, channel_map[channel].bank_msb);
            new_player.rt_bank_change_lsb(channel, channel_map[channel].bank_lsb);
            new_player.rt_program_change(channel, channel_map[channel].gm);
        }
    }

    ::active_emulator_id = index;
}